

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctoquadIdentifier.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::TrigramAlphabet::MegaMatch(TrigramAlphabet *this,char16 *input,int inputLen)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  undefined1 *puVar4;
  char16 *pcVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  
  this->input = input;
  this->inputLen = inputLen;
  if ((7 < inputLen) && (inputLen != 8)) {
    pcVar5 = input + 2;
    bVar1 = this->alphaBits[(ushort)input[1] & 0x5f];
    uVar9 = 3;
    lVar8 = 0x300000000;
    uVar10 = (uint)(byte)this->alphaBits[(ushort)*input & 0x5f];
    do {
      uVar7 = (uint)bVar1;
      bVar1 = this->alphaBits[(ushort)*pcVar5 & 0x5f];
      lVar6 = (ulong)(uVar10 * 0x40 + uVar7 * 8) + (ulong)bVar1;
      if (((uint)lVar6 < 0xdd) && (lVar6 = (long)this->trigramMap[lVar6], lVar6 != 0x41)) {
        uVar10 = this->trigramStarts[lVar6].count;
        if (0 < (int)uVar10) {
          uVar12 = 0;
          lVar13 = 5;
          lVar11 = lVar8;
          do {
            uVar2 = *(ushort *)((long)input + (lVar11 >> 0x1f));
            if ((0x7f < uVar2) || (this->alphaBits[uVar2 & 0x5f] == 4)) goto LAB_00e63771;
            uVar12 = (1 << (this->alphaBits[uVar2 & 0x5f] & 0x1fU)) + uVar12 * 0x10;
            lVar11 = lVar11 + 0x100000000;
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
          lVar11 = 0;
          do {
            if ((uVar12 & ~*(uint *)((long)&this->trigramStarts[lVar6].patterns[0].encodedPattern +
                                    lVar11)) == 0) {
              puVar4 = *(undefined1 **)
                        (*(long *)((long)&this->trigramStarts[lVar6].patterns[0].pattern + lVar11) +
                        0x30);
              iVar3 = *(int *)(puVar4 + 0xc);
              if ((long)iVar3 < 0x20) {
                *(int *)(puVar4 + 0xc) = iVar3 + 1;
                *(int *)(puVar4 + (long)iVar3 * 4 + 0x10) = (int)uVar9 + -3;
              }
              else {
                *puVar4 = 0;
              }
            }
            lVar11 = lVar11 + 0x10;
          } while ((ulong)uVar10 << 4 != lVar11);
        }
      }
LAB_00e63771:
      pcVar5 = input + uVar9;
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x100000000;
      uVar10 = uVar7;
    } while (uVar9 != inputLen - 5);
  }
  return;
}

Assistant:

void TrigramAlphabet::MegaMatch(__in_ecount(inputLen) const char16* input,int inputLen) {
        this->input=input;
        this->inputLen=inputLen;
        if (inputLen<TrigramInfo::PatternLength) {
            return;
        }
        // prime the pump
        unsigned char c1=alphaBits[input[0]&UpperCaseMask];
        unsigned char c2=alphaBits[input[1]&UpperCaseMask];
        unsigned char c3=alphaBits[input[2]&UpperCaseMask];
        // pump
        for (int k=3;k<inputLen-5;k++) {
            int index=(c1<<6)+(c2<<3)+c3;
            if (index<TrigramMapSize) {
                int t=trigramMap[index];
                if (t!=TrigramNotInPattern) {
                    int count=trigramStarts[t].count;
                    if (count>0) {
                        int inputMask=0;
                        bool validInput=true;
                        for (int j=0;j<5;j++) {
                            // ascii check
                            if (input[k+j]<128) {
                                int bits=alphaBits[input[k+j]&UpperCaseMask];
                                if (bits==BitsNotInAlpha) {
                                    validInput=false;
                                    break;
                                }
                                inputMask=(inputMask<<AlphaCount)+(1<<bits);
                            }
                            else {
                                validInput=false;
                                break;
                            }
                        }
                        if (validInput) {
                            for (int j=0;j<count;j++) {
                                PatternTri* tri= &(trigramStarts[t].patterns[j]);
                                if ((inputMask&(tri->encodedPattern))==inputMask) {
                                    if (tri->pattern->rep.unified.trigramInfo->resultCount<TrigramInfo::MaxResults) {
                                        tri->pattern->rep.unified.trigramInfo->offsets[tri->pattern->rep.unified.trigramInfo->resultCount++]=k-3;
                                    }
                                    else {
                                        tri->pattern->rep.unified.trigramInfo->isTrigramPattern=false;
                                    }
                                }
                            }
                        }
                    }
                }
            }
            c1=c2;
            c2=c3;
            c3=alphaBits[input[k]&UpperCaseMask];
        }
    }